

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeParameter(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *this;
  RepeatedField<unsigned_long> *this_00;
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  string *layerName;
  uint uVar5;
  int iVar6;
  Type *pTVar7;
  Type *pTVar8;
  Type *this_01;
  BlobShape *pBVar9;
  LayerUnion this_02;
  long *plVar10;
  LogMessage *pLVar11;
  undefined8 *puVar12;
  WeightParams *pWVar13;
  uint uVar14;
  BlobShape *pBVar15;
  long *plVar16;
  ulong *puVar17;
  size_type *psVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  ParameterParameter *pPVar23;
  uint new_size;
  long lVar24;
  long in_stack_00000008;
  long in_stack_00000010;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  int *in_stack_00000048;
  string __str_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string __str;
  undefined1 local_178 [56];
  long *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 uStack_128;
  Type *local_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  long *local_78 [2];
  long local_68 [2];
  Type *local_58;
  string local_50;
  
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  iVar6 = getLayerIndex(pTVar7,in_stack_00000030);
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000010 + 0x70),iVar6);
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (in_stack_00000018,(Type *)0x0);
  if ((pTVar7->top_).super_RepeatedPtrFieldBase.current_size_ == 1) {
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Must have 1 output","");
    errorInCaffeProto((string *)local_178,(pTVar7->name_).ptr_,(pTVar7->type_).ptr_);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((pTVar7->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_178,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_178,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_178);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_d8,(value_type *)((pTVar7->top_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  convertCaffeMetadata
            ((pTVar7->name_).ptr_,&local_98,&local_d8,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)in_stack_00000018,
             in_stack_00000028);
  pPVar23 = pTVar7->parameter_param_;
  if (pPVar23 == (ParameterParameter *)0x0) {
    pPVar23 = (ParameterParameter *)&caffe::_ParameterParameter_default_instance_;
  }
  if (((pPVar23->_has_bits_).has_bits_[0] & 1) == 0) {
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"Must have \'shape\' set","");
    errorInCaffeProto((string *)local_178,(pTVar7->name_).ptr_,(pTVar7->type_).ptr_);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
  }
  pBVar9 = pPVar23->shape_;
  pBVar15 = pBVar9;
  if (pBVar9 == (BlobShape *)0x0) {
    pBVar15 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if (1 < (pBVar15->dim_).current_size_ - 3U) {
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"\'shape\' must be either 3 or 4 dimensions","");
    errorInCaffeProto((string *)local_178,(pTVar7->name_).ptr_,(pTVar7->type_).ptr_);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    pBVar9 = pPVar23->shape_;
  }
  if (pBVar9 == (BlobShape *)0x0) {
    pBVar9 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if (((pBVar9->dim_).current_size_ == 4) && (((pBVar9->dim_).rep_)->elements[0] != 1)) {
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"if \'shape\' is of 4 dimesnions, first one must be 1","");
    errorInCaffeProto((string *)local_178,(pTVar7->name_).ptr_,(pTVar7->type_).ptr_);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
  }
  if ((pTVar8->blobs_).super_RepeatedPtrFieldBase.current_size_ != 1) {
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"Must have 1 weight blob","");
    errorInCaffeProto((string *)local_178,(pTVar7->name_).ptr_,(pTVar7->type_).ptr_);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
  }
  if (this_01->_oneof_case_[0] == 0x122) {
    this_02 = this_01->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0x122;
    this_02.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::LoadConstantLayerParams::LoadConstantLayerParams(this_02.loadconstant_);
    (this_01->layer_).loadconstant_ = (LoadConstantLayerParams *)this_02;
  }
  pBVar9 = pPVar23->shape_;
  if (pBVar9 == (BlobShape *)0x0) {
    pBVar9 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  iVar6 = (pBVar9->dim_).current_size_;
  local_58 = pTVar7;
  plVar10 = google::protobuf::RepeatedField<long>::Get(&pBVar9->dim_,iVar6 + -3);
  pBVar9 = pPVar23->shape_;
  if (pBVar9 == (BlobShape *)0x0) {
    pBVar9 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  pvVar2 = (void *)*plVar10;
  local_120 = pTVar8;
  plVar10 = google::protobuf::RepeatedField<long>::Get(&pBVar9->dim_,iVar6 + -2);
  pBVar9 = pPVar23->shape_;
  if (pBVar9 == (BlobShape *)0x0) {
    pBVar9 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  pvVar3 = (void *)*plVar10;
  plVar10 = google::protobuf::RepeatedField<long>::Get(&pBVar9->dim_,iVar6 + -1);
  if ((long)pvVar2 < 0) {
    __assert_fail("c >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Parameter.cpp"
                  ,0x3b,
                  "void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pvVar4 = (void *)*plVar10;
  this_00 = &(this_02.convolution_)->kernelsize_;
  iVar6 = ((this_02.convolution_)->kernelsize_).current_size_;
  if (iVar6 == ((this_02.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,iVar6 + 1);
    iVar6 = this_00->current_size_;
  }
  pWVar13 = (this_02.innerproduct_)->bias_;
  iVar22 = iVar6 + 1;
  ((this_02.convolution_)->kernelsize_).current_size_ = iVar22;
  (&pWVar13->_internal_metadata_)[iVar6].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = pvVar2;
  if ((long)pvVar3 < 0) {
    __assert_fail("h >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Parameter.cpp"
                  ,0x3d,
                  "void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  if (iVar22 == ((this_02.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,iVar6 + 2);
    iVar22 = ((this_02.convolution_)->kernelsize_).current_size_;
    pWVar13 = (this_02.innerproduct_)->bias_;
  }
  iVar6 = iVar22 + 1;
  this_00->current_size_ = iVar6;
  (&pWVar13->_internal_metadata_)[iVar22].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = pvVar3;
  if ((long)pvVar4 < 0) {
    __assert_fail("w >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Parameter.cpp"
                  ,0x3f,
                  "void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  if (iVar6 == ((this_02.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,iVar22 + 2);
    iVar6 = ((this_02.convolution_)->kernelsize_).current_size_;
    pWVar13 = (this_02.innerproduct_)->bias_;
  }
  this_00->current_size_ = iVar6 + 1;
  (&pWVar13->_internal_metadata_)[iVar6].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = pvVar4;
  if ((local_120->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_178,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_178,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_178);
  }
  lVar24 = (long)pvVar3 * (long)pvVar2 * (long)pvVar4;
  uVar1 = *(uint *)((long)((local_120->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18)
  ;
  new_size = (uint)lVar24;
  pTVar7 = local_120;
  if (uVar1 == new_size) goto LAB_003d1382;
  uVar21 = -new_size;
  if (0 < (int)new_size) {
    uVar21 = new_size;
  }
  uVar20 = 1;
  if (9 < uVar21) {
    uVar19 = (ulong)uVar21;
    uVar5 = 4;
    do {
      uVar20 = uVar5;
      uVar14 = (uint)uVar19;
      if (uVar14 < 100) {
        uVar20 = uVar20 - 2;
        goto LAB_003d0fca;
      }
      if (uVar14 < 1000) {
        uVar20 = uVar20 - 1;
        goto LAB_003d0fca;
      }
      if (uVar14 < 10000) goto LAB_003d0fca;
      uVar19 = uVar19 / 10000;
      uVar5 = uVar20 + 4;
    } while (99999 < uVar14);
    uVar20 = uVar20 + 1;
  }
LAB_003d0fca:
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct
            ((ulong)local_78,(char)uVar20 - ((char)((ulong)lVar24 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(new_size >> 0x1f) + (long)local_78[0]),uVar20,uVar21);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x5e4537);
  local_b8 = &local_a8;
  plVar16 = plVar10 + 2;
  if ((long *)*plVar10 == plVar16) {
    local_a8 = *plVar16;
    lStack_a0 = plVar10[3];
  }
  else {
    local_a8 = *plVar16;
    local_b8 = (long *)*plVar10;
  }
  local_b0 = plVar10[1];
  *plVar10 = (long)plVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_118 = &local_108;
  puVar17 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar17) {
    local_108 = *puVar17;
    lStack_100 = plVar10[3];
  }
  else {
    local_108 = *puVar17;
    local_118 = (ulong *)*plVar10;
  }
  local_110 = plVar10[1];
  *plVar10 = (long)puVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  uVar21 = -uVar1;
  if (0 < (int)uVar1) {
    uVar21 = uVar1;
  }
  uVar20 = 1;
  if (9 < uVar21) {
    uVar19 = (ulong)uVar21;
    uVar5 = 4;
    do {
      uVar20 = uVar5;
      uVar14 = (uint)uVar19;
      if (uVar14 < 100) {
        uVar20 = uVar20 - 2;
        goto LAB_003d1120;
      }
      if (uVar14 < 1000) {
        uVar20 = uVar20 - 1;
        goto LAB_003d1120;
      }
      if (uVar14 < 10000) goto LAB_003d1120;
      uVar19 = uVar19 / 10000;
      uVar5 = uVar20 + 4;
    } while (99999 < uVar14);
    uVar20 = uVar20 + 1;
  }
LAB_003d1120:
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar20 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_f8),uVar20,uVar21);
  pTVar7 = local_58;
  uVar19 = 0xf;
  if (local_118 != &local_108) {
    uVar19 = local_108;
  }
  if (uVar19 < (ulong)(local_f0 + local_110)) {
    uVar19 = 0xf;
    if (local_f8 != local_e8) {
      uVar19 = local_e8[0];
    }
    if (uVar19 < (ulong)(local_f0 + local_110)) goto LAB_003d11b0;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_118);
  }
  else {
LAB_003d11b0:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_f8);
  }
  local_140 = &local_130;
  plVar10 = puVar12 + 2;
  if ((long *)*puVar12 == plVar10) {
    local_130 = *plVar10;
    uStack_128 = puVar12[3];
  }
  else {
    local_130 = *plVar10;
    local_140 = (long *)*puVar12;
  }
  local_138 = puVar12[1];
  *puVar12 = plVar10;
  puVar12[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar18 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar18) {
    local_178._16_8_ = *psVar18;
    local_178._24_4_ = (undefined4)plVar10[3];
    local_178._28_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
    local_178._0_8_ = local_178 + 0x10;
  }
  else {
    local_178._16_8_ = *psVar18;
    local_178._0_8_ = (size_type *)*plVar10;
  }
  local_178._8_8_ = plVar10[1];
  *plVar10 = (long)psVar18;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  layerName = (pTVar7->name_).ptr_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Inner Product","");
  errorInCaffeProto((string *)local_178,layerName,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pTVar7 = local_120;
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
LAB_003d1382:
  pWVar13 = (this_02.batchnorm_)->variance_;
  if (pWVar13 == (WeightParams *)0x0) {
    pWVar13 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar13);
    (this_02.batchnorm_)->variance_ = pWVar13;
  }
  if ((int)new_size < 0) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_178,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_178,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_178);
  }
  this = &pWVar13->floatvalue_;
  if (this->current_size_ < (int)new_size) {
    google::protobuf::RepeatedField<float>::Reserve(this,new_size);
    uVar1 = this->current_size_;
    if (uVar1 != new_size) {
      memset(((pWVar13->floatvalue_).rep_)->elements + (int)uVar1,0,
             (long)(int)new_size * 4 + (long)(int)uVar1 * -4);
    }
  }
  this->current_size_ = new_size;
  if ((pTVar7->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_178,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_178,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_178);
  }
  pvVar2 = ((pTVar7->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if ((RepeatedField<float> *)((long)pvVar2 + 0x18) != this) {
    this->current_size_ = 0;
    iVar6 = *(int *)((long)pvVar2 + 0x18);
    if (iVar6 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(this,iVar6);
      memcpy(((pWVar13->floatvalue_).rep_)->elements + (pWVar13->floatvalue_).current_size_,
             (void *)(*(long *)((long)pvVar2 + 0x20) + 8),(long)*(int *)((long)pvVar2 + 0x18) << 2);
      (pWVar13->floatvalue_).current_size_ =
           (pWVar13->floatvalue_).current_size_ + *(int *)((long)pvVar2 + 0x18);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ParameterParameter& caffeLayerParams = caffeLayer.parameter_param();
    //***************** Some Error Checking in Caffe Proto **********
    if (!caffeLayerParams.has_shape()){
        CoreMLConverter::errorInCaffeProto("Must have 'shape' set", caffeLayer.name(), caffeLayer.type());
    }
    if (! (caffeLayerParams.shape().dim_size() == 3 || caffeLayerParams.shape().dim_size() == 4)){
        CoreMLConverter::errorInCaffeProto("'shape' must be either 3 or 4 dimensions",caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerParams.shape().dim_size() == 4 && caffeLayerParams.shape().dim(0) != 1){
        CoreMLConverter::errorInCaffeProto("if 'shape' is of 4 dimesnions, first one must be 1",caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerWeights.blobs_size() != 1){
        CoreMLConverter::errorInCaffeProto("Must have 1 weight blob",caffeLayer.name(), caffeLayer.type());
    }
    //***************************************************************
    Specification::LoadConstantLayerParams* specLayerParams = specLayer->mutable_loadconstant();
    int dim = caffeLayerParams.shape().dim_size();
    int64_t c = caffeLayerParams.shape().dim(dim-3);
    int64_t h = caffeLayerParams.shape().dim(dim-2);
    int64_t w = caffeLayerParams.shape().dim(dim-1);
    assert(c >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(c));
    assert(h >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(h));
    assert(w >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(w));

    int blobSize = static_cast<int> (c*h*w);
    int caffeBlobSize = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSize != blobSize){
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+
                        std::to_string(caffeBlobSize)+" in caffe", caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* dataWrite = specLayerParams->mutable_data()->mutable_floatvalue();
    dataWrite->Resize(blobSize, 0.0);
    dataWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
}